

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O3

FreeTiles * __thiscall
mahjong::PlayerHand::makeFreeTiles(FreeTiles *__return_storage_ptr__,PlayerHand *this)

{
  allocator_type local_9;
  
  if ((this->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<mahjong::Tile,std::allocator<mahjong::Tile>>::
    vector<std::_Rb_tree_const_iterator<mahjong::Tile>,void>
              ((vector<mahjong::Tile,std::allocator<mahjong::Tile>> *)__return_storage_ptr__,
               (this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<mahjong::Tile>)
               &(this->tiles)._M_t._M_impl.super__Rb_tree_header,&local_9);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

PlayerHand::FreeTiles PlayerHand::makeFreeTiles() const
{
	if (melds.empty())
	{
		return FreeTiles(tiles.begin(), tiles.end());
	}

	return {};
}